

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O1

int Extra_BitMatrixIsDisjoint(Extra_BitMat_t *p1,Extra_BitMat_t *p2)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = p1->nSize;
  if (uVar1 != p2->nSize) {
    __assert_fail("p1->nSize == p2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/extra/extraUtilBitMatrix.c"
                  ,0x174,"int Extra_BitMatrixIsDisjoint(Extra_BitMat_t *, Extra_BitMat_t *)");
  }
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if (0 < p1->nWords) {
        uVar3 = 0;
        do {
          if ((p1->ppData[uVar2][uVar3] & p2->ppData[uVar2][uVar3]) != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)p1->nWords != uVar3);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
  return 1;
}

Assistant:

int Extra_BitMatrixIsDisjoint( Extra_BitMat_t * p1, Extra_BitMat_t * p2 )
{
    int i, w;
    assert( p1->nSize == p2->nSize );
    for ( i = 0; i < p1->nSize; i++ )
        for ( w = 0; w < p1->nWords; w++ )
            if ( p1->ppData[i][w] & p2->ppData[i][w] )
                return 0;
    return 1;
}